

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnTableCopyExpr
          (BinaryReaderInterp *this,Index dst_index,Index src_index)

{
  Index index;
  bool bVar1;
  Location local_f8;
  Var local_d8;
  Location local_90;
  Var local_70;
  Enum local_24;
  Index local_20;
  Index local_1c;
  Index src_index_local;
  Index dst_index_local;
  BinaryReaderInterp *this_local;
  
  local_20 = src_index;
  local_1c = dst_index;
  _src_index_local = this;
  Location::Location(&local_90);
  Var::Var(&local_70,dst_index,&local_90);
  index = local_20;
  Location::Location(&local_f8);
  Var::Var(&local_d8,index,&local_f8);
  local_24 = (Enum)SharedValidator::OnTableCopy
                             (&this->validator_,
                              (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,&local_70,
                              &local_d8);
  bVar1 = Failed((Result)local_24);
  Var::~Var(&local_d8);
  Var::~Var(&local_70);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Istream::Emit(this->istream_,TableCopy,local_1c,local_20);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnTableCopyExpr(Index dst_index, Index src_index) {
  CHECK_RESULT(validator_.OnTableCopy(loc, Var(dst_index), Var(src_index)));
  istream_.Emit(Opcode::TableCopy, dst_index, src_index);
  return Result::Ok;
}